

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

Pattern * trieste::T(Pattern *__return_storage_ptr__,Token *type)

{
  initializer_list<trieste::Token> __l;
  initializer_list<trieste::Token> __l_00;
  allocator<trieste::Token> local_132;
  less<trieste::Token> local_131;
  Token local_130;
  iterator local_128;
  size_type local_120;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_118;
  FastPattern local_e8;
  undefined1 local_80 [55];
  allocator<trieste::Token> local_49;
  Token local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<trieste::Token,_std::allocator<trieste::Token>_> types;
  Token *type_local;
  
  local_48 = (Token)type->def;
  local_40 = &local_48;
  local_38 = 1;
  types.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = type;
  CLI::std::allocator<trieste::Token>::allocator(&local_49);
  __l_00._M_len = local_38;
  __l_00._M_array = local_40;
  CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_30,__l_00,&local_49);
  CLI::std::allocator<trieste::Token>::~allocator(&local_49);
  std::
  make_shared<trieste::detail::TokenMatch,std::vector<trieste::Token,std::allocator<trieste::Token>>&>
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_80);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::TokenMatch,void>
            ((shared_ptr<trieste::detail::PatternDef> *)(local_80 + 0x10),
             (shared_ptr<trieste::detail::TokenMatch> *)local_80);
  local_130 = (Token)(types.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->def;
  local_128 = &local_130;
  local_120 = 1;
  CLI::std::allocator<trieste::Token>::allocator(&local_132);
  __l._M_len = local_120;
  __l._M_array = local_128;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            (&local_118,__l,&local_131,&local_132);
  detail::FastPattern::match_token(&local_e8,&local_118);
  detail::Pattern::Pattern(__return_storage_ptr__,(PatternPtr *)(local_80 + 0x10),&local_e8);
  detail::FastPattern::~FastPattern(&local_e8);
  CLI::std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_118);
  CLI::std::allocator<trieste::Token>::~allocator(&local_132);
  CLI::std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr
            ((shared_ptr<trieste::detail::PatternDef> *)(local_80 + 0x10));
  std::shared_ptr<trieste::detail::TokenMatch>::~shared_ptr
            ((shared_ptr<trieste::detail::TokenMatch> *)local_80);
  CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::~vector
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

inline detail::Pattern T(const Token& type)
  {
    std::vector<Token> types = {type};
    return detail::Pattern(
      std::make_shared<detail::TokenMatch>(types),
      detail::FastPattern::match_token({type}));
  }